

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeVector.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMNodeVector::removeElementAt(DOMNodeVector *this,XMLSize_t index)

{
  ulong uVar1;
  
  if (index < this->nextFreeSlot) {
    uVar1 = this->nextFreeSlot - 1;
    for (; index < uVar1; index = index + 1) {
      this->data[index] = this->data[index + 1];
    }
    this->nextFreeSlot = uVar1;
    return;
  }
  __assert_fail("index < nextFreeSlot",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeVector.cpp"
                ,0x6a,"void xercesc_4_0::DOMNodeVector::removeElementAt(XMLSize_t)");
}

Assistant:

void DOMNodeVector::removeElementAt(XMLSize_t index) {
	assert(index < nextFreeSlot);
	for (XMLSize_t i=index; i<nextFreeSlot-1; ++i) {
		data[i] = data[i+1];
	}
	--nextFreeSlot;
}